

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::Keyboard::
clear_keyboard_input(Keyboard *this)

{
  bool bVar1;
  pointer this_00;
  Keyboard *this_local;
  
  this->keyboard_input_ = this->keyboard_input_ & 0x7f;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->string_serialiser_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
              ::operator->(&this->string_serialiser_);
    bVar1 = Utility::StringSerialiser::advance(this_00);
    if (!bVar1) {
      std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
      reset(&this->string_serialiser_,(pointer)0x0);
    }
  }
  return;
}

Assistant:

void clear_keyboard_input() {
				keyboard_input_ &= 0x7f;
				if(string_serialiser_ && !string_serialiser_->advance()) {
					string_serialiser_.reset();
				}
			}